

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gauge.hpp
# Opt level: O2

void __thiscall
ylt::metric::basic_dynamic_gauge<double,_(unsigned_char)'\x02'>::basic_dynamic_gauge
          (basic_dynamic_gauge<double,_(unsigned_char)__x02_> *this,string *name,string *help,
          array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
          *labels_name)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
  local_68;
  
  std::__cxx11::string::string(&local_88,name);
  std::__cxx11::string::string(&bStack_a8,help);
  std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>::
  array(&local_68,labels_name);
  basic_dynamic_counter<double,_(unsigned_char)'\x02'>::basic_dynamic_counter
            (&this->super_basic_dynamic_counter<double,_(unsigned_char)__x02_>,&local_88,&bStack_a8,
             &local_68);
  std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>::
  ~array(&local_68);
  std::__cxx11::string::~string((string *)&bStack_a8);
  std::__cxx11::string::~string((string *)&local_88);
  (this->super_basic_dynamic_counter<double,_(unsigned_char)__x02_>).
  super_dynamic_metric_impl<std::atomic<double>,_(unsigned_char)__x02_>.super_dynamic_metric.
  super_metric_t._vptr_metric_t = (_func_int **)&PTR__dynamic_metric_impl_001e9928;
  (this->super_basic_dynamic_counter<double,_(unsigned_char)__x02_>).
  super_dynamic_metric_impl<std::atomic<double>,_(unsigned_char)__x02_>.super_dynamic_metric.
  super_metric_t.type_ = Gauge;
  return;
}

Assistant:

basic_dynamic_gauge(std::string name, std::string help,
                      std::array<std::string, N> labels_name)
      : Base(std::move(name), std::move(help), std::move(labels_name)) {
    set_metric_type(MetricType::Gauge);
  }